

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O1

void wasm::PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::scan
               (Finder *self,Expression **currp)

{
  char *__function;
  Expression *currp_00;
  Expression *pEVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  _func_void_Finder_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar1 = *currp;
  switch(pEVar1->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-delegations-fields.def"
                       ,0xb0);
  case BlockId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitBlock,currp);
    if (pEVar1->_id != BlockId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
LAB_007917e0:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) {
LAB_0079147d:
          __assert_fail("index < usedElements",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                        ,0xbc,
                        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                       );
        }
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case IfId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitIf,currp);
    if (pEVar1->_id != IfId) {
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      goto LAB_007917e0;
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>)
                     .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_00791466;
  case LoopId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitLoop,currp);
    if (pEVar1->_id != LoopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
      goto LAB_007917e0;
    }
    goto LAB_0079104e;
  case BreakId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitBreak,currp);
    if (pEVar1->_id != BreakId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      goto LAB_007917e0;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>)
                     .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    if (*(long *)(pEVar1 + 2) == 0) {
      return;
    }
    goto LAB_00790ca1;
  case SwitchId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSwitch,currp);
    if (pEVar1->_id != SwitchId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      goto LAB_007917e0;
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[4].type);
    local_38 = pEVar1 + 4;
    lVar5 = *(long *)(pEVar1 + 4);
    goto joined_r0x00790a50;
  case CallId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitCall,currp);
    if (pEVar1->_id != CallId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Call]";
      goto LAB_007917e0;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case CallIndirectId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitCallIndirect,
               currp);
    if (pEVar1->_id != CallIndirectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallIndirect]";
      goto LAB_007917e0;
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 2)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 2) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 2) <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(pEVar1[1].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case LocalGetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitLocalGet,currp)
    ;
    if (pEVar1->_id != LocalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalGet]";
      goto LAB_007917e0;
    }
    break;
  case LocalSetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitLocalSet,currp)
    ;
    if (pEVar1->_id != LocalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::LocalSet]";
      goto LAB_007917e0;
    }
    goto LAB_0079113c;
  case GlobalGetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitGlobalGet,currp
              );
    if (pEVar1->_id != GlobalGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalGet]";
      goto LAB_007917e0;
    }
    break;
  case GlobalSetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitGlobalSet,currp
              );
    if (pEVar1->_id != GlobalSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::GlobalSet]";
      goto LAB_007917e0;
    }
    goto LAB_0079104e;
  case LoadId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitLoad,currp);
    if (pEVar1->_id != LoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Load]";
      goto LAB_007917e0;
    }
    pEVar1 = pEVar1 + 3;
    goto LAB_007913b7;
  case StoreId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStore,currp);
    if (pEVar1->_id != StoreId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Store]";
      goto LAB_007917e0;
    }
    goto LAB_00791105;
  case ConstId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitConst,currp);
    if (pEVar1->_id != ConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Const]";
      goto LAB_007917e0;
    }
    break;
  case UnaryId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitUnary,currp);
    if (pEVar1->_id != UnaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unary]";
      goto LAB_007917e0;
    }
    goto LAB_0079113c;
  case BinaryId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitBinary,currp);
    if (pEVar1->_id != BinaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Binary]";
      goto LAB_007917e0;
    }
    goto LAB_00791397;
  case SelectId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSelect,currp);
    if (pEVar1->_id != SelectId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Select]";
      goto LAB_007917e0;
    }
    goto LAB_00790d71;
  case DropId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitDrop,currp);
    if (pEVar1->_id != DropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Drop]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case ReturnId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitReturn,currp);
    if (pEVar1->_id != ReturnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_007917e0;
    }
    goto LAB_00790a47;
  case MemorySizeId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitMemorySize,
               currp);
    if (pEVar1->_id != MemorySizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemorySize]";
      goto LAB_007917e0;
    }
    break;
  case MemoryGrowId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitMemoryGrow,
               currp);
    if (pEVar1->_id != MemoryGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryGrow]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case NopId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitNop,currp);
    if (pEVar1->_id != NopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Nop]";
      goto LAB_007917e0;
    }
    break;
  case UnreachableId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitUnreachable,
               currp);
    if (pEVar1->_id != UnreachableId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Unreachable]";
      goto LAB_007917e0;
    }
    break;
  case AtomicRMWId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitAtomicRMW,currp
              );
    if (pEVar1->_id != AtomicRMWId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicRMW]";
      goto LAB_007917e0;
    }
    goto LAB_007911db;
  case AtomicCmpxchgId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitAtomicCmpxchg,
               currp);
    if (pEVar1->_id != AtomicCmpxchgId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicCmpxchg]";
      goto LAB_007917e0;
    }
    goto LAB_007911c1;
  case AtomicWaitId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitAtomicWait,
               currp);
    if (pEVar1->_id != AtomicWaitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicWait]";
      goto LAB_007917e0;
    }
    goto LAB_007908de;
  case AtomicNotifyId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitAtomicNotify,
               currp);
    if (pEVar1->_id != AtomicNotifyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicNotify]";
      goto LAB_007917e0;
    }
    goto LAB_00791397;
  case AtomicFenceId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitAtomicFence,
               currp);
    if (pEVar1->_id != AtomicFenceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::AtomicFence]";
      goto LAB_007917e0;
    }
    break;
  case SIMDExtractId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSIMDExtract,
               currp);
    if (pEVar1->_id != SIMDExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDExtract]";
      goto LAB_007917e0;
    }
    goto LAB_0079113c;
  case SIMDReplaceId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSIMDReplace,
               currp);
    if (pEVar1->_id != SIMDReplaceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDReplace]";
      goto LAB_007917e0;
    }
    currp_00 = (Expression *)&pEVar1[2].type;
    goto LAB_007913a2;
  case SIMDShuffleId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSIMDShuffle,
               currp);
    if (pEVar1->_id != SIMDShuffleId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShuffle]";
      goto LAB_007917e0;
    }
    goto LAB_00791315;
  case SIMDTernaryId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSIMDTernary,
               currp);
    if (pEVar1->_id != SIMDTernaryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDTernary]";
      goto LAB_007917e0;
    }
    goto LAB_007908de;
  case SIMDShiftId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSIMDShift,currp
              );
    if (pEVar1->_id != SIMDShiftId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDShift]";
      goto LAB_007917e0;
    }
    goto LAB_00791397;
  case SIMDLoadId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitSIMDLoad,currp)
    ;
    if (pEVar1->_id != SIMDLoadId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoad]";
      goto LAB_007917e0;
    }
    goto LAB_00790f83;
  case SIMDLoadStoreLaneId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    if (pEVar1->_id != SIMDLoadStoreLaneId) {
      __function = "T *wasm::Expression::cast() [T = wasm::SIMDLoadStoreLane]";
      goto LAB_007917e0;
    }
LAB_00791105:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
    pEVar1 = pEVar1 + 3;
    goto LAB_007913b7;
  case MemoryInitId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitMemoryInit,
               currp);
    if (pEVar1->_id != MemoryInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryInit]";
      goto LAB_007917e0;
    }
LAB_007911c1:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_007911db;
  case DataDropId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitDataDrop,currp)
    ;
    if (pEVar1->_id != DataDropId) {
      __function = "T *wasm::Expression::cast() [T = wasm::DataDrop]";
      goto LAB_007917e0;
    }
    break;
  case MemoryCopyId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitMemoryCopy,
               currp);
    if (pEVar1->_id != MemoryCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryCopy]";
      goto LAB_007917e0;
    }
    goto LAB_00790d71;
  case MemoryFillId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitMemoryFill,
               currp);
    if (pEVar1->_id != MemoryFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::MemoryFill]";
      goto LAB_007917e0;
    }
    goto LAB_00790d71;
  case PopId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitPop,currp);
    if (pEVar1->_id != PopId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Pop]";
      goto LAB_007917e0;
    }
    break;
  case RefNullId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRefNull,currp);
    if (pEVar1->_id != RefNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefNull]";
      goto LAB_007917e0;
    }
    break;
  case RefIsNullId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRefIsNull,currp
              );
    if (pEVar1->_id != RefIsNullId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefIsNull]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case RefFuncId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRefFunc,currp);
    if (pEVar1->_id != RefFuncId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefFunc]";
      goto LAB_007917e0;
    }
    break;
  case RefEqId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRefEq,currp);
    if (pEVar1->_id != RefEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefEq]";
      goto LAB_007917e0;
    }
    goto LAB_00791315;
  case TableGetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitTableGet,currp)
    ;
    if (pEVar1->_id != TableGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGet]";
      goto LAB_007917e0;
    }
    goto LAB_0079104e;
  case TableSetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitTableSet,currp)
    ;
    if (pEVar1->_id != TableSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSet]";
      goto LAB_007917e0;
    }
    goto LAB_007911db;
  case TableSizeId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitTableSize,currp
              );
    if (pEVar1->_id != TableSizeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableSize]";
      goto LAB_007917e0;
    }
    break;
  case TableGrowId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitTableGrow,currp
              );
    if (pEVar1->_id != TableGrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TableGrow]";
      goto LAB_007917e0;
    }
LAB_007911db:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    pEVar1 = pEVar1 + 2;
    goto LAB_007913b7;
  case TryId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitTry,currp);
    if (pEVar1->_id != TryId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
      goto LAB_007917e0;
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar1 + 5)) {
      uVar3 = (ulong)((uint)*(undefined8 *)(pEVar1 + 5) & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (*(ulong *)(pEVar1 + 5) <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(pEVar1[4].type.id + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
LAB_0079104e:
    pEVar1 = pEVar1 + 2;
    goto LAB_007913b7;
  case ThrowId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitThrow,currp);
    if (pEVar1->_id != ThrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_007917e0;
    }
    uVar2 = (uint)pEVar1[2].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[2].type.id <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 2) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RethrowId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRethrow,currp);
    if (pEVar1->_id != RethrowId) {
      __function = "T *wasm::Expression::cast() [T = wasm::Rethrow]";
      goto LAB_007917e0;
    }
    break;
  case TupleMakeId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitTupleMake,currp
              );
    if (pEVar1->_id != TupleMakeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleMake]";
      goto LAB_007917e0;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case TupleExtractId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitTupleExtract,
               currp);
    if (pEVar1->_id != TupleExtractId) {
      __function = "T *wasm::Expression::cast() [T = wasm::TupleExtract]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case I31NewId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitI31New,currp);
    if (pEVar1->_id != I31NewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31New]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case I31GetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitI31Get,currp);
    if (pEVar1->_id != I31GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::I31Get]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case CallRefId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitCallRef,currp);
    if (pEVar1->_id != CallRefId) {
      __function = "T *wasm::Expression::cast() [T = wasm::CallRef]";
      goto LAB_007917e0;
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case RefTestId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRefTest,currp);
    if (pEVar1->_id != RefTestId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefTest]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case RefCastId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRefCast,currp);
    if (pEVar1->_id != RefCastId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefCast]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case BrOnId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitBrOn,currp);
    if (pEVar1->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_007917e0;
    }
LAB_00790f83:
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_007913b7;
  case StructNewId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStructNew,currp
              );
    if (pEVar1->_id != StructNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructNew]";
      goto LAB_007917e0;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case StructGetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStructGet,currp
              );
    if (pEVar1->_id != StructGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructGet]";
      goto LAB_007917e0;
    }
    goto LAB_0079113c;
  case StructSetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStructSet,currp
              );
    if (pEVar1->_id != StructSetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StructSet]";
      goto LAB_007917e0;
    }
    goto LAB_00791397;
  case ArrayNewId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayNew,currp)
    ;
    if (pEVar1->_id != ArrayNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNew]";
      goto LAB_007917e0;
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
LAB_00790a47:
    local_38 = pEVar1 + 1;
    lVar5 = *(long *)(pEVar1 + 1);
joined_r0x00790a50:
    if (lVar5 != 0) {
LAB_00790ca1:
      local_40 = scan;
      SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>)
                     .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    break;
  case ArrayNewSegId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayNewSeg,
               currp);
    if (pEVar1->_id != ArrayNewSegId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewSeg]";
      goto LAB_007917e0;
    }
    goto LAB_00790aef;
  case ArrayNewFixedId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayNewFixed,
               currp);
    if (pEVar1->_id != ArrayNewFixedId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayNewFixed]";
      goto LAB_007917e0;
    }
    uVar2 = (uint)pEVar1[1].type.id;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)(uVar2 & 0x7fffffff);
      lVar5 = uVar3 * 8;
      lVar4 = uVar3 + 1;
      do {
        lVar5 = lVar5 + -8;
        if (pEVar1[1].type.id <= lVar4 - 2U) goto LAB_0079147d;
        Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
                  ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
                   (Expression **)(*(long *)(pEVar1 + 1) + lVar5));
        lVar4 = lVar4 + -1;
      } while (1 < lVar4);
    }
    break;
  case ArrayGetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayGet,currp)
    ;
    if (pEVar1->_id != ArrayGetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayGet]";
      goto LAB_007917e0;
    }
    goto LAB_00791315;
  case ArraySetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArraySet,currp)
    ;
    if (pEVar1->_id != ArraySetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArraySet]";
      goto LAB_007917e0;
    }
    goto LAB_00790d71;
  case ArrayLenId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayLen,currp)
    ;
    if (pEVar1->_id != ArrayLenId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayLen]";
      goto LAB_007917e0;
    }
    goto LAB_0079136f;
  case ArrayCopyId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayCopy,currp
              );
    if (pEVar1->_id != ArrayCopyId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayCopy]";
      goto LAB_007917e0;
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    goto LAB_00790880;
  case ArrayFillId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayFill,currp
              );
    if (pEVar1->_id != ArrayFillId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayFill]";
      goto LAB_007917e0;
    }
LAB_00790880:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    goto LAB_00790d71;
  case ArrayInitId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitArrayInit,currp
              );
    if (pEVar1->_id != ArrayInitId) {
      __function = "T *wasm::Expression::cast() [T = wasm::ArrayInit]";
      goto LAB_007917e0;
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 4));
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[3].type);
LAB_00790aef:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 3));
    pEVar1 = (Expression *)&pEVar1[2].type;
    goto LAB_007913b7;
  case RefAsId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitRefAs,currp);
    if (pEVar1->_id != RefAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::RefAs]";
      goto LAB_007917e0;
    }
    goto LAB_0079113c;
  case StringNewId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringNew,currp
              );
    if (pEVar1->_id != StringNewId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringNew]";
      goto LAB_007917e0;
    }
    local_38 = pEVar1 + 3;
    local_40 = scan;
    if (*(long *)(pEVar1 + 3) != 0) {
      SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>)
                     .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>)
                     .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    local_38 = pEVar1 + 2;
    local_40 = scan;
    if (*(long *)(pEVar1 + 2) != 0) {
      SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>)
                     .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_00791466;
  case StringConstId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringConst,
               currp);
    if (pEVar1->_id != StringConstId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConst]";
      goto LAB_007917e0;
    }
    break;
  case StringMeasureId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringMeasure,
               currp);
    if (pEVar1->_id != StringMeasureId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringMeasure]";
      goto LAB_007917e0;
    }
    goto LAB_0079113c;
  case StringEncodeId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringEncode,
               currp);
    if (pEVar1->_id != StringEncodeId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEncode]";
      goto LAB_007917e0;
    }
    local_38 = (Expression *)&pEVar1[2].type;
    local_40 = scan;
    if (pEVar1[2].type.id != 0) {
      SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
      ::
      emplace_back<void(*&)(wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder*,wasm::Expression**),wasm::Expression**&>
                ((SmallVector<wasm::Walker<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,wasm::UnifiedExpressionVisitor<wasm::FindAll<wasm::LocalSet>::FindAll(wasm::Expression*)::Finder,void>>::Task,10ul>
                  *)&(self->super_PostWalker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>)
                     .super_Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>.stack,
                 &local_40,(Expression ***)&local_38);
    }
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    pEVar1 = (Expression *)&pEVar1[1].type;
LAB_00791466:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)pEVar1);
    break;
  case StringConcatId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringConcat,
               currp);
    if (pEVar1->_id != StringConcatId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringConcat]";
      goto LAB_007917e0;
    }
    goto LAB_00791315;
  case StringEqId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringEq,currp)
    ;
    if (pEVar1->_id != StringEqId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringEq]";
      goto LAB_007917e0;
    }
    goto LAB_00791397;
  case StringAsId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringAs,currp)
    ;
    if (pEVar1->_id != StringAsId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringAs]";
      goto LAB_007917e0;
    }
LAB_0079113c:
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_007913b7;
  case StringWTF8AdvanceId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::
               doVisitStringWTF8Advance,currp);
    if (pEVar1->_id != StringWTF8AdvanceId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF8Advance]";
      goto LAB_007917e0;
    }
LAB_00790d71:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)(pEVar1 + 2));
    goto LAB_00791315;
  case StringWTF16GetId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringWTF16Get,
               currp);
    if (pEVar1->_id != StringWTF16GetId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringWTF16Get]";
      goto LAB_007917e0;
    }
    goto LAB_00791315;
  case StringIterNextId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringIterNext,
               currp);
    if (pEVar1->_id != StringIterNextId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterNext]";
      goto LAB_007917e0;
    }
LAB_0079136f:
    pEVar1 = pEVar1 + 1;
LAB_007913b7:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)pEVar1);
    return;
  case StringIterMoveId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringIterMove,
               currp);
    if (pEVar1->_id != StringIterMoveId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringIterMove]";
      goto LAB_007917e0;
    }
LAB_00791397:
    currp_00 = pEVar1 + 2;
LAB_007913a2:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)currp_00);
    pEVar1 = (Expression *)&pEVar1[1].type;
    goto LAB_007913b7;
  case StringSliceWTFId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringSliceWTF,
               currp);
    if (pEVar1->_id != StringSliceWTFId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceWTF]";
      goto LAB_007917e0;
    }
LAB_007908de:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[2].type);
    currp_00 = pEVar1 + 2;
    goto LAB_007913a2;
  case StringSliceIterId:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,
               Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::doVisitStringSliceIter
               ,currp);
    if (pEVar1->_id != StringSliceIterId) {
      __function = "T *wasm::Expression::cast() [T = wasm::StringSliceIter]";
      goto LAB_007917e0;
    }
LAB_00791315:
    Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_>::pushTask
              ((Walker<Finder,_wasm::UnifiedExpressionVisitor<Finder,_void>_> *)self,scan,
               (Expression **)&pEVar1[1].type);
    pEVar1 = pEVar1 + 1;
    goto LAB_007913b7;
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_INT_ARRAY(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_NAME_VECTOR(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE_VECTOR(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }